

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O0

void __thiscall raspicam::_private::Private_Impl_Still::commitISO(Private_Impl_Still *this)

{
  MMAL_STATUS_T MVar1;
  ostream *poVar2;
  long *in_RDI;
  
  MVar1 = mmal_port_parameter_set_uint32
                    (*(MMAL_PORT_T **)(*in_RDI + 0x20),0x10030,*(uint32_t *)((long)in_RDI + 0x4c));
  if (MVar1 != MMAL_SUCCESS) {
    poVar2 = std::operator<<((ostream *)&std::cout,(char *)in_RDI[0xf]);
    std::operator<<(poVar2,": Failed to set ISO parameter.\n");
  }
  return;
}

Assistant:

void Private_Impl_Still::commitISO() {
            if ( mmal_port_parameter_set_uint32 ( camera->control, MMAL_PARAMETER_ISO, iso ) != MMAL_SUCCESS )
                cout << API_NAME << ": Failed to set ISO parameter.\n";
        }